

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SafeInt.hpp
# Opt level: O0

void AdditionHelper<unsigned_char,_long,_9>::
     AdditionThrow<safeint_exception_handlers::SafeInt_InvalidParameter>
               (uchar *lhs,long *rhs,uchar *result)

{
  byte bVar1;
  ulong uVar2;
  code *pcVar3;
  byte bVar4;
  char *in_RDX;
  ulong *in_RSI;
  byte *in_RDI;
  uint64_t tmp;
  
  if ((long)*in_RSI < 0) {
    if ((ulong)*in_RDI < (*in_RSI ^ 0xffffffffffffffff) + 1) {
LAB_00137ad4:
      safeint_exception_handlers::SafeInt_InvalidParameter::SafeIntOnOverflow();
    }
    if (SCARRY8((ulong)*in_RDI,*in_RSI)) {
      pcVar3 = (code *)invalidInstructionException();
      (*pcVar3)();
    }
    *in_RDX = *in_RDI + (char)*in_RSI;
  }
  else {
    bVar1 = *in_RDI;
    uVar2 = *in_RSI;
    bVar4 = std::numeric_limits<unsigned_char>::max();
    if ((ulong)bVar4 < bVar1 + uVar2) goto LAB_00137ad4;
    *in_RDX = (char)(bVar1 + uVar2);
  }
  return;
}

Assistant:

SAFEINT_CONSTEXPR14 static void AdditionThrow( const T& lhs, const U& rhs, T& result ) SAFEINT_CPP_THROW
    {
        // lhs is unsigned and < 64-bit, rhs std::int64_t
        if( rhs < 0 )
        {
            if( lhs >= ~(std::uint64_t)( rhs ) + 1) //negation is safe, since rhs is 64-bit
            {
                result = (T)( lhs + rhs );
                return;
            }
        }
        else
        {
            // now we know that rhs can be safely cast into an std::uint64_t
            std::uint64_t tmp = (std::uint64_t)lhs + (std::uint64_t)rhs;

            // special case - rhs cannot be larger than 0x7fffffffffffffff, lhs cannot be larger than 0xffffffff
            // it is not possible for the operation above to overflow, so just check max
            if( tmp <= std::numeric_limits<T>::max() )
            {
                result = (T)tmp;
                return;
            }
        }
        E::SafeIntOnOverflow();
    }